

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O0

void writeKeys<unsigned_long>
               (string *str,vector<unsigned_long,_std::allocator<unsigned_long>_> *keys,
               string *key_type,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  size_t this;
  bool bVar1;
  const_reference pvVar2;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int *local_108;
  int *val;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t local_30;
  size_t n_local;
  vector<int,_std::allocator<int>_> *mapping_local;
  string *key_type_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *keys_local;
  string *str_local;
  
  local_30 = n;
  n_local = (size_t)mapping;
  mapping_local = (vector<int,_std::allocator<int>_> *)key_type;
  key_type_local = (string *)keys;
  keys_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)str;
  std::operator+(&local_b0,"    static constexpr std::array<",key_type);
  std::operator+(&local_90,&local_b0,", ");
  std::__cxx11::to_string((string *)&i,local_30 + 1);
  std::operator+(&local_70,&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  std::operator+(&local_50,&local_70,"> keys {\n        ");
  std::__cxx11::string::operator+=((string *)keys_local,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  this = n_local;
  __range1 = (vector<int,_std::allocator<int>_> *)0x0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)n_local);
  val = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&val);
    if (!bVar1) break;
    local_108 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end1);
    if ((__range1 != (vector<int,_std::allocator<int>_> *)0x0) && ((ulong)__range1 % 10 == 0)) {
      std::__cxx11::string::operator+=((string *)keys_local,"\n        ");
    }
    __range1 = (vector<int,_std::allocator<int>_> *)
               ((long)&(__range1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
    if (*local_108 == -1) {
      std::__cxx11::string::operator+=((string *)keys_local,"0,");
    }
    else {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)key_type_local,
                          (long)*local_108);
      std::__cxx11::to_string(&local_148,*pvVar2);
      std::operator+(&local_128,&local_148,",");
      std::__cxx11::string::operator+=((string *)keys_local,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::__cxx11::string::operator+=((string *)keys_local,"\n    };\n");
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<KeyType>& keys,
               std::string key_type,
               const std::vector<int>& mapping,
               size_t n){
    str += "    static constexpr std::array<" + key_type + ", " + std::to_string(n+1) + "> keys {\n        ";

    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row==0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else    str += std::to_string(keys[val]) + ",";
    }
    str += "\n    };\n";
}